

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O2

SVInt __thiscall slang::SVInt::createFillZ(SVInt *this,bitwidth_t bitWidth,bool isSigned)

{
  undefined8 extraout_RDX;
  SVInt SVar1;
  
  allocUninitialized(this,bitWidth,isSigned,true);
  setAllZ(this);
  SVar1.super_SVIntStorage.bitWidth = (int)extraout_RDX;
  SVar1.super_SVIntStorage.signFlag = (bool)(char)((ulong)extraout_RDX >> 0x20);
  SVar1.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)extraout_RDX >> 0x28);
  SVar1.super_SVIntStorage._14_2_ = (short)((ulong)extraout_RDX >> 0x30);
  SVar1.super_SVIntStorage.field_0.pVal = (uint64_t *)this;
  return (SVInt)SVar1.super_SVIntStorage;
}

Assistant:

SVInt SVInt::createFillZ(bitwidth_t bitWidth, bool isSigned) {
    SVInt result = SVInt::allocUninitialized(bitWidth, isSigned, true);
    result.setAllZ();
    return result;
}